

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_dynhds_add_custom(Curl_easy *data,_Bool is_connect,dynhds *hds)

{
  char cVar1;
  char *__s;
  uchar uVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  size_t valuelen;
  size_t sVar7;
  curl_slist *pcVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  size_t namelen;
  curl_slist *h [2];
  long local_60;
  curl_slist *local_58 [2];
  connectdata *local_48;
  long local_40;
  dynhds *local_38;
  
  local_38 = hds;
  local_48 = data->conn;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    local_58[0] = (data->set).headers;
    local_60 = 1;
    if ((((ulong)data->conn->bits & 9) == 1) && (((data->set).field_0x8ca & 8) != 0)) {
      local_58[1] = (data->set).proxyheaders;
      local_60 = 2;
    }
  }
  else {
    if (((data->set).field_0x8ca & 8) == 0) {
      local_58[0] = (data->set).headers;
    }
    else {
      local_58[0] = (data->set).proxyheaders;
    }
    local_60 = 1;
  }
  local_40 = 0;
  do {
    for (pcVar8 = local_58[local_40]; pcVar8 != (curl_slist *)0x0; pcVar8 = pcVar8->next) {
      __s = pcVar8->data;
      pcVar6 = strchr(__s,0x3a);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strchr(__s,0x3b);
        if (pcVar6 != (char *)0x0) {
          namelen = (long)pcVar6 - (long)__s;
          do {
            do {
              do {
                pcVar6 = pcVar6 + 1;
                cVar1 = *pcVar6;
              } while (cVar1 == '\t');
            } while (cVar1 == ' ');
            if (cVar1 == '\0') goto LAB_001331ae;
          } while ((byte)(cVar1 - 10U) < 4);
          if (cVar1 == '\0') {
LAB_001331ae:
            pcVar6 = "";
            valuelen = 0;
            goto LAB_001331b8;
          }
        }
      }
      else {
        namelen = (long)pcVar6 - (long)__s;
        do {
          do {
            do {
              pcVar6 = pcVar6 + 1;
              cVar1 = *pcVar6;
            } while (cVar1 == '\t');
          } while (cVar1 == ' ');
          if (cVar1 == '\0') goto LAB_001332b9;
        } while ((byte)(cVar1 - 10U) < 4);
        if (cVar1 != '\0') {
          valuelen = strlen(pcVar6);
LAB_001331b8:
          if ((namelen == 5) && ((data->state).aptr.host != (char *)0x0)) {
            sVar7 = 5;
            pcVar9 = "Host:";
LAB_00133296:
            iVar4 = curl_strnequal(__s,pcVar9,sVar7);
            if (iVar4 != 0) goto LAB_001332b9;
          }
          else {
            uVar2 = (data->state).httpreq;
            if (uVar2 == '\x02') {
              if (namelen == 0xd) {
                iVar4 = curl_strnequal(__s,"Content-Type:",0xd);
                if (iVar4 != 0) goto LAB_001332b9;
                uVar2 = (data->state).httpreq;
                goto LAB_00133210;
              }
            }
            else {
LAB_00133210:
              if ((namelen == 0xd) && (uVar2 == '\x03')) {
                sVar7 = 0xd;
                pcVar9 = "Content-Type:";
                goto LAB_00133296;
              }
            }
            if ((namelen == 0xf) && ((*(uint *)&(data->req).field_0xd9 & 0x40000) != 0)) {
              sVar7 = 0xf;
              pcVar9 = "Content-Length:";
              goto LAB_00133296;
            }
            if ((namelen == 0xb) && ((data->state).aptr.te != (char *)0x0)) {
              sVar7 = 0xb;
              pcVar9 = "Connection:";
              goto LAB_00133296;
            }
            if ((namelen == 0x12) && (0x13 < local_48->httpversion)) {
              sVar7 = 0x12;
              pcVar9 = "Transfer-Encoding:";
              goto LAB_00133296;
            }
            if (namelen == 7) {
              sVar7 = 7;
              pcVar9 = "Cookie:";
LAB_001332ee:
              iVar4 = curl_strnequal(__s,pcVar9,sVar7);
              if ((iVar4 != 0) && (_Var3 = Curl_auth_allowed_to_host(data), !_Var3))
              goto LAB_001332b9;
            }
            else if (namelen == 0xe) {
              sVar7 = 0xe;
              pcVar9 = "Authorization:";
              goto LAB_001332ee;
            }
          }
          CVar5 = Curl_dynhds_add(local_38,__s,namelen,pcVar6,valuelen);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
        }
      }
LAB_001332b9:
    }
    local_40 = local_40 + 1;
    if (local_40 == local_60) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_dynhds_add_custom(struct Curl_easy *data,
                                bool is_connect,
                                struct dynhds *hds)
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      const char *name, *value;
      size_t namelen, valuelen;

      /* There are 2 quirks in place for custom headers:
       * 1. setting only 'name:' to suppress a header from being sent
       * 2. setting only 'name;' to send an empty (illegal) header
       */
      ptr = strchr(headers->data, ':');
      if(ptr) {
        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(*ptr) {
          value = ptr;
          valuelen = strlen(value);
        }
        else {
          /* quirk #1, suppress this header */
          continue;
        }
      }
      else {
        ptr = strchr(headers->data, ';');

        if(!ptr) {
          /* neither : nor ; in provided header value. We seem
           * to ignore this silently */
          continue;
        }

        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the semicolon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(!*ptr) {
          /* quirk #2, send an empty header */
          value = "";
          valuelen = 0;
        }
        else {
          /* this may be used for something else in the future,
           * ignore this for now */
          continue;
        }
      }

      DEBUGASSERT(name && value);
      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom Host:
            header as that will produce *two* in the same request! */
         hd_name_eq(name, namelen, STRCONST("Host:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              hd_name_eq(name, namelen, STRCONST("Content-Length:")))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              hd_name_eq(name, namelen, STRCONST("Connection:")))
        ;
      else if((conn->httpversion >= 20) &&
              hd_name_eq(name, namelen, STRCONST("Transfer-Encoding:")))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((hd_name_eq(name, namelen, STRCONST("Authorization:")) ||
               hd_name_eq(name, namelen, STRCONST("Cookie:"))) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else {
        CURLcode result;

        result = Curl_dynhds_add(hds, name, namelen, value, valuelen);
        if(result)
          return result;
      }
    }
  }

  return CURLE_OK;
}